

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

int Kf_ManComputeDelay(Kf_Man_t *p,int fEval)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  int *pCut;
  int iVar6;
  int i;
  int Time;
  
  if (fEval != 0) {
    for (iVar6 = 0; iVar6 < p->pGia->nObjs; iVar6 = iVar6 + 1) {
      pGVar5 = Gia_ManObj(p->pGia,iVar6);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
        iVar2 = Gia_ObjRefNum(p->pGia,pGVar5);
        if (0 < iVar2) {
          pCut = Kf_ObjCutBest(p,iVar6);
          iVar4 = 0;
          for (iVar2 = 1; iVar2 <= *pCut; iVar2 = iVar2 + 1) {
            iVar3 = Kf_CutLeaf(pCut,iVar2);
            iVar3 = Vec_IntEntry(&p->vTime,iVar3);
            if (iVar4 <= iVar3) {
              iVar4 = iVar3;
            }
          }
          Vec_IntWriteEntry(&p->vTime,iVar6,iVar4 + 1);
        }
      }
    }
  }
  iVar2 = 0;
  iVar6 = 0;
  while( true ) {
    if (p->pGia->vCos->nSize <= iVar2) {
      return iVar6;
    }
    pGVar5 = Gia_ManCo(p->pGia,iVar2);
    uVar1 = *(undefined8 *)pGVar5;
    iVar4 = Gia_ObjRefNum(p->pGia,pGVar5 + -(ulong)((uint)uVar1 & 0x1fffffff));
    if (iVar4 < 1) break;
    iVar4 = Gia_ObjId(p->pGia,pGVar5 + -(ulong)((uint)uVar1 & 0x1fffffff));
    iVar4 = Vec_IntEntry(&p->vTime,iVar4);
    if (iVar6 <= iVar4) {
      iVar6 = iVar4;
    }
    iVar2 = iVar2 + 1;
  }
  __assert_fail("Gia_ObjRefNum(p->pGia, pObj) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                ,0x385,"int Kf_ManComputeDelay(Kf_Man_t *, int)");
}

Assistant:

int Kf_ManComputeDelay( Kf_Man_t * p, int fEval )
{
    Gia_Obj_t * pObj; 
    int i, Delay = 0;
    if ( fEval )
    {
        Gia_ManForEachAnd( p->pGia, pObj, i )
            if ( Gia_ObjRefNum(p->pGia, pObj) > 0 )
                Vec_IntWriteEntry( &p->vTime, i, Kf_CutTime(p, Kf_ObjCutBest(p, i)) );
    }
    Gia_ManForEachCoDriver( p->pGia, pObj, i )
    {
        assert( Gia_ObjRefNum(p->pGia, pObj) > 0 );
        Delay = Abc_MaxInt( Delay, Kf_ObjTime(p, Gia_ObjId(p->pGia, pObj)) );
    }
    return Delay;
}